

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O1

gboolean timerSourceCheck(GSource *source)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((((char)source[1].flags == '\0') && (source[1].context != (GMainContext *)0x0)) &&
     ((source[1].priority & 8) == 0)) {
    bVar1 = QTimerInfoList::hasPendingTimers((QTimerInfoList *)(source + 1));
    uVar2 = (uint)!bVar1;
  }
  return uVar2;
}

Assistant:

static gboolean timerSourceCheck(GSource *source)
{
    GTimerSource *src = reinterpret_cast<GTimerSource *>(source);
    if (src->runWithIdlePriority)
        return false;
    return timerSourceCheckHelper(src);
}